

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O3

MessageBuilder * __thiscall
tcu::MessageBuilder::operator=(MessageBuilder *this,MessageBuilder *other)

{
  long *local_30;
  long local_20 [2];
  
  this->m_log = other->m_log;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator= (const MessageBuilder& other)
{
	m_log = other.m_log;
	m_str.str(other.m_str.str());
	return *this;
}